

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::extendTrace(Exception *this,uint ignoreCount)

{
  kj *this_00;
  uint in_ECX;
  ulong uVar1;
  size_t count;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> AVar2;
  Array<void_*> newTraceSpace_heap;
  void *newTraceSpace_stack [40];
  
  count = (ulong)ignoreCount + 0x21;
  if (ignoreCount < 8) {
    newTraceSpace_heap.ptr = (void **)0x0;
    newTraceSpace_heap.size_ = 0;
    newTraceSpace_heap.disposer = (ArrayDisposer *)0x0;
    this_00 = (kj *)newTraceSpace_stack;
  }
  else {
    this_00 = (kj *)_::HeapArrayDisposer::allocate<void*>(count);
    newTraceSpace_heap.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    newTraceSpace_heap.ptr = (void **)this_00;
    newTraceSpace_heap.size_ = count;
  }
  space.size_._0_4_ = ignoreCount + 1;
  space.ptr = (void **)count;
  space.size_._4_4_ = 0;
  AVar2 = getStackTrace(this_00,space,in_ECX);
  space.size_ = AVar2.size_;
  if (ignoreCount + 2 < space.size_) {
    uVar1 = 0x20 - (ulong)this->traceCount;
    if (space.size_ <= uVar1) {
      uVar1 = space.size_;
    }
    memcpy(this->trace + this->traceCount,AVar2.ptr,uVar1 * 8);
    this->traceCount = this->traceCount + (int)uVar1;
  }
  Array<void_*>::~Array(&newTraceSpace_heap);
  return;
}

Assistant:

void Exception::extendTrace(uint ignoreCount) {
  KJ_STACK_ARRAY(void*, newTraceSpace, kj::size(trace) + ignoreCount + 1,
      sizeof(trace)/sizeof(trace[0]) + 8, 128);

  auto newTrace = kj::getStackTrace(newTraceSpace, ignoreCount + 1);
  if (newTrace.size() > ignoreCount + 2) {
    // Remove suffix that won't fit into our static-sized trace.
    newTrace = newTrace.slice(0, kj::min(kj::size(trace) - traceCount, newTrace.size()));

    // Copy the rest into our trace.
    memcpy(trace + traceCount, newTrace.begin(), newTrace.asBytes().size());
    traceCount += newTrace.size();
  }
}